

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShaderGenerator.cpp
# Opt level: O3

void __thiscall
rsg::ShaderGenerator::generate
          (ShaderGenerator *this,ShaderParameters *shaderParams,Shader *shader,
          vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *outputs)

{
  VariableManager *pVVar1;
  pointer *ppuVar2;
  Scalar SVar3;
  Version VVar4;
  pointer ppVVar5;
  undefined8 *puVar6;
  VariableType *type;
  iterator __position;
  ConstValueRangeAccess value;
  ConstValueRangeAccess value_00;
  ConstValueRangeAccess value_01;
  ConstValueRangeAccess value_02;
  ConstValueRangeAccess value_03;
  ConstValueRangeAccess valueRange_00;
  ConstValueRangeAccess valueRange_01;
  undefined8 uVar7;
  undefined8 uVar8;
  deBool dVar9;
  Variable *pVVar10;
  pointer ppVVar11;
  const_iterator __position_00;
  iterator iVar12;
  Variable *variable_00;
  const_iterator __position_01;
  iterator iVar13;
  ValueEntry *pVVar14;
  ShaderInput *pSVar15;
  DeclarationStatement *this_00;
  TestError *this_01;
  char *pcVar16;
  char *pcVar17;
  Scalar *pSVar18;
  int comp;
  Scalar *pSVar19;
  pointer ppVVar20;
  pointer ppSVar21;
  pointer ppVVar22;
  long lVar23;
  ulong uVar24;
  GeneratorState *pGVar25;
  int comp_2;
  _Alloc_hider _Var26;
  vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_> entries;
  ReservedScalars reservedScalars;
  Variable *variable;
  ValueRange valueRange;
  ValueScope globalValueScope;
  PrettyPrinter local_2c8;
  ReservedScalars local_294;
  TokenStream local_290;
  VariableManager *local_270;
  ShaderInput *local_268 [2];
  ShaderInput local_258;
  Scalar *local_220;
  VariableType *local_218;
  Scalar *pSStack_210;
  Scalar *local_208;
  VariableType *local_200;
  Scalar *pSStack_1f8;
  Scalar *local_1f0;
  undefined1 local_1e8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  int local_1c0;
  VariableType *local_1b8;
  pointer pMStack_1b0;
  pointer local_1a8;
  pointer pMStack_1a0;
  Scalar *local_198;
  Scalar *local_190;
  Scalar *local_180;
  Scalar *local_178 [34];
  Variable *local_68;
  pointer pSStack_60;
  Scalar *local_58;
  ValueScope local_48;
  
  ValueScope::ValueScope(&local_48);
  GeneratorState::setShader(this->m_state,shaderParams,shader);
  local_294.numScalars = 0;
  if (shader->m_type == TYPE_VERTEX) {
    VariableManager::reserve(this->m_state->m_varManager,&local_294,8);
  }
  pVVar1 = &this->m_varManager;
  VariableManager::pushVariableScope(pVVar1,&shader->m_globalScope);
  VariableManager::pushValueScope(pVVar1,&local_48);
  local_270 = pVVar1;
  for (ppSVar21 = (outputs->
                  super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
      ppSVar21 !=
      (outputs->super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>)._M_impl
      .super__Vector_impl_data._M_finish; ppSVar21 = ppSVar21 + 1) {
    pSVar15 = *ppSVar21;
    pVVar10 = VariableManager::allocate
                        (this->m_state->m_varManager,&pSVar15->m_variable->m_type,STORAGE_SHADER_OUT
                         ,(pSVar15->m_variable->m_name)._M_dataplus._M_p);
    local_58 = (pSVar15->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_68 = pSVar15->m_variable;
    pSStack_60 = (pSVar15->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    uVar7 = pSVar15->m_variable;
    uVar8 = (pSVar15->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_start;
    value.m_min = (Scalar *)uVar8;
    value.m_type = (VariableType *)uVar7;
    value.m_max = local_58;
    VariableManager::setValue(this->m_state->m_varManager,pVVar10,value);
  }
  local_1e8._8_8_ = &local_1d0;
  if (shader->m_type == TYPE_FRAGMENT) {
    local_1e8._0_8_ = (GeneratorState *)0x1;
    local_1e8._16_8_ = (pointer)0x0;
    local_1d0._M_local_buf[0] = '\0';
    local_1c0 = 4;
    local_1b8 = (VariableType *)0x0;
    pMStack_1b0 = (pointer)0x0;
    local_1a8 = (pointer)0x0;
    pMStack_1a0 = (pointer)0x0;
    VVar4 = this->m_state->m_programParams->version;
    pcVar17 = "dEQP_FragColor";
    if (VVar4 != VERSION_300) {
      pcVar17 = (char *)0x0;
    }
    pcVar16 = "gl_FragColor";
    if (VVar4 != VERSION_100) {
      pcVar16 = pcVar17;
    }
    pVVar10 = VariableManager::allocate
                        (this->m_state->m_varManager,(VariableType *)local_1e8,STORAGE_SHADER_OUT,
                         pcVar16);
    VariableType::~VariableType((VariableType *)local_1e8);
    ValueRange::ValueRange((ValueRange *)local_1e8,&pVVar10->m_type);
    local_2c8.m_line._M_dataplus._M_p = (pointer)0x0;
    local_2c8.m_line._M_string_length = 0;
    pSVar19 = (Scalar *)0x0;
    pSVar18 = local_198;
    if (local_198 == local_190) {
      pSVar18 = pSVar19;
    }
    do {
      SVar3 = *(Scalar *)((long)&local_2c8.m_line._M_dataplus._M_p + (long)pSVar19 * 4);
      VariableType::getElementType((VariableType *)local_1e8);
      pSVar18[(long)pSVar19] = SVar3;
      pSVar19 = (Scalar *)((long)pSVar19 + 1);
    } while (pSVar19 != (Scalar *)0x4);
    local_2c8.m_line._M_dataplus._M_p = (pointer)0x3f8000003f800000;
    local_2c8.m_line._M_string_length = 0x3f8000003f800000;
    pSVar19 = (Scalar *)0x0;
    pSVar18 = local_180;
    if (local_180 == local_178[0]) {
      pSVar18 = pSVar19;
    }
    do {
      SVar3 = *(Scalar *)((long)&local_2c8.m_line._M_dataplus._M_p + (long)pSVar19 * 4);
      VariableType::getElementType((VariableType *)local_1e8);
      pSVar18[(long)pSVar19] = SVar3;
      pSVar19 = (Scalar *)((long)pSVar19 + 1);
    } while (pSVar19 != (Scalar *)0x4);
    pVVar10->m_layoutLocation = 0;
    pSStack_1f8 = local_198;
    if (local_198 == local_190) {
      pSStack_1f8 = (Scalar *)0x0;
    }
    local_1f0 = local_180;
    if (local_180 == local_178[0]) {
      local_1f0 = (Scalar *)0x0;
    }
    value_00.m_min = pSStack_1f8;
    value_00.m_type = (VariableType *)local_1e8;
    value_00.m_max = local_1f0;
    local_200 = (VariableType *)local_1e8;
    VariableManager::setValue(this->m_state->m_varManager,pVVar10,value_00);
    ValueRange::~ValueRange((ValueRange *)local_1e8);
  }
  local_1e8._8_8_ = &local_1d0;
  local_1e8._0_8_ = (GeneratorState *)0x0;
  local_1e8._16_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_1d0._M_local_buf[0] = '\0';
  local_1c0 = 0;
  local_1b8 = (VariableType *)0x0;
  pMStack_1b0 = (pointer)0x0;
  local_1a8 = (pointer)0x0;
  pMStack_1a0 = (pointer)0x0;
  VariableType::operator=(&(shader->m_mainFunction).m_returnType,(VariableType *)local_1e8);
  VariableType::~VariableType((VariableType *)local_1e8);
  if (shaderParams->randomize == true) {
    FunctionGenerator::FunctionGenerator
              ((FunctionGenerator *)local_1e8,this->m_state,&shader->m_mainFunction);
    ppVVar20 = (shader->m_globalScope).m_liveVariables.
               super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppVVar11 = (shader->m_globalScope).m_liveVariables.
               super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (ppVVar20 != ppVVar11) {
      do {
        if ((*ppVVar20)->m_storage == STORAGE_SHADER_OUT) {
          FunctionGenerator::requireAssignment((FunctionGenerator *)local_1e8,*ppVVar20);
          ppVVar11 = (shader->m_globalScope).m_liveVariables.
                     super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        }
        ppVVar20 = ppVVar20 + 1;
      } while (ppVVar20 != ppVVar11);
    }
    FunctionGenerator::generate((FunctionGenerator *)local_1e8);
    FunctionGenerator::~FunctionGenerator((FunctionGenerator *)local_1e8);
  }
  else {
    pGVar25 = this->m_state;
    if (shader->m_type == TYPE_VERTEX) {
      local_2c8.m_line._M_dataplus._M_p = (pointer)0x0;
      local_2c8.m_line._M_string_length = 0;
      local_2c8.m_line.field_2._M_allocated_capacity = 0;
      ppVVar22 = (pGVar25->m_varManager->m_entryCache).
                 super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppVVar5 = (pGVar25->m_varManager->m_entryCache).
                super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVVar22 != ppVVar5) {
        __position_00._M_current = (ValueEntry **)0x0;
        do {
          iVar12 = std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::
                   insert((vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                           *)&local_2c8,__position_00,ppVVar22);
          __position_00._M_current = iVar12._M_current + 1;
          ppVVar22 = ppVVar22 + 1;
        } while (ppVVar22 != ppVVar5);
        if (local_2c8.m_line._M_dataplus._M_p != (pointer)local_2c8.m_line._M_string_length) {
          _Var26._M_p = local_2c8.m_line._M_dataplus._M_p;
          do {
            puVar6 = *(undefined8 **)_Var26._M_p;
            type = (VariableType *)*puVar6;
            local_1e8._0_8_ = local_1e8 + 0x10;
            local_1e8._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_1e8._16_8_ = local_1e8._16_8_ & 0xffffffffffffff00;
            if (type[1].m_baseType == TYPE_INT) {
              std::__cxx11::string::_M_replace((ulong)local_1e8,0,(char *)0x0,0x17035f);
              deStringBeginsWith(type[1].m_typeName._M_dataplus._M_p,"v_");
              std::__cxx11::string::append(local_1e8);
              pVVar10 = VariableManager::allocate
                                  (pGVar25->m_varManager,type,STORAGE_SHADER_IN,
                                   (char *)local_1e8._0_8_);
              local_290.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)puVar6[0xb];
              local_290.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage = (pointer)puVar6[0xe];
              if (local_290.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_finish == (pointer)puVar6[0xc]) {
                local_290.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              }
              if ((Scalar *)
                  local_290.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage == (Scalar *)puVar6[0xf]) {
                local_290.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              }
              local_290.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl
              .super__Vector_impl_data._M_start = (pointer)(puVar6 + 1);
              value_02.m_min =
                   (Scalar *)
                   local_290.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              value_02.m_type =
                   (VariableType *)
                   local_290.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              value_02.m_max =
                   (Scalar *)
                   local_290.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
              VariableManager::setValue(pGVar25->m_varManager,pVVar10,value_02);
              anon_unknown_26::createAssignment
                        (&(shader->m_mainFunction).m_functionBlock,(Variable *)*puVar6,pVVar10);
              if ((GeneratorState *)local_1e8._0_8_ != (GeneratorState *)(local_1e8 + 0x10)) {
                operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
              }
            }
            _Var26._M_p = _Var26._M_p + 8;
          } while (_Var26._M_p != (pointer)local_2c8.m_line._M_string_length);
        }
        if ((long *)local_2c8.m_line._M_dataplus._M_p != (long *)0x0) {
          operator_delete(local_2c8.m_line._M_dataplus._M_p,
                          local_2c8.m_line.field_2._M_allocated_capacity -
                          (long)local_2c8.m_line._M_dataplus._M_p);
        }
      }
    }
    else {
      VVar4 = pGVar25->m_programParams->version;
      pcVar17 = (char *)0x0;
      if (VVar4 == VERSION_300) {
        pcVar17 = "dEQP_FragColor";
      }
      pcVar16 = "gl_FragColor";
      if (VVar4 != VERSION_100) {
        pcVar16 = pcVar17;
      }
      ppVVar22 = (pGVar25->m_varManager->m_entryCache).
                 super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppVVar5 = (pGVar25->m_varManager->m_entryCache).
                super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      while( true ) {
        if (ppVVar22 == ppVVar5) {
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_01,(char *)0x0,"fragColorEntry",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/randomshaders/rsgShaderGenerator.cpp"
                     ,0x80);
          __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        pVVar14 = *ppVVar22;
        dVar9 = deStringEqual((pVVar14->m_variable->m_name)._M_dataplus._M_p,pcVar16);
        if (dVar9 != 0) break;
        ppVVar22 = ppVVar22 + 1;
      }
      pVVar10 = VariableManager::allocate
                          (pGVar25->m_varManager,&pVVar14->m_variable->m_type,STORAGE_SHADER_IN,
                           "v_color");
      local_1e8._8_8_ =
           (pVVar14->m_valueRange).m_min.
           super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_1e8._16_8_ =
           (pVVar14->m_valueRange).m_max.
           super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._8_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(pVVar14->m_valueRange).m_min.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_finish) {
        local_1e8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._16_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(pVVar14->m_valueRange).m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_finish) {
        local_1e8._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
      }
      local_1e8._0_8_ = &pVVar14->m_valueRange;
      value_01.m_min = (Scalar *)local_1e8._8_8_;
      value_01.m_type = (VariableType *)local_1e8._0_8_;
      value_01.m_max = (Scalar *)local_1e8._16_8_;
      VariableManager::setValue(pGVar25->m_varManager,pVVar10,value_01);
      anon_unknown_26::createAssignment
                (&(shader->m_mainFunction).m_functionBlock,pVVar14->m_variable,pVVar10);
    }
  }
  if (shader->m_type == TYPE_VERTEX) {
    VariableManager::release(this->m_state->m_varManager,&local_294);
    local_1e8._0_8_ = (GeneratorState *)0x1;
    local_1e8._16_8_ = (pointer)0x0;
    local_1d0._M_local_buf[0] = '\0';
    local_1c0 = 4;
    local_1b8 = (VariableType *)0x0;
    pMStack_1b0 = (pointer)0x0;
    local_1a8 = (pointer)0x0;
    pMStack_1a0 = (pointer)0x0;
    local_1e8._8_8_ = &local_1d0;
    pVVar10 = VariableManager::allocate
                        (this->m_state->m_varManager,(VariableType *)local_1e8,STORAGE_SHADER_OUT,
                         "gl_Position");
    VariableType::~VariableType((VariableType *)local_1e8);
    local_1e8._0_8_ = (GeneratorState *)0x1;
    local_1e8._16_8_ = (pointer)0x0;
    local_1d0._M_local_buf[0] = '\0';
    local_1c0 = 4;
    local_1b8 = (VariableType *)0x0;
    pMStack_1b0 = (pointer)0x0;
    local_1a8 = (pointer)0x0;
    pMStack_1a0 = (pointer)0x0;
    local_1e8._8_8_ = &local_1d0;
    variable_00 = VariableManager::allocate
                            (this->m_state->m_varManager,(VariableType *)local_1e8,STORAGE_SHADER_IN
                             ,"dEQP_Position");
    VariableType::~VariableType((VariableType *)local_1e8);
    ValueRange::ValueRange((ValueRange *)local_1e8,&pVVar10->m_type);
    local_2c8.m_line._M_dataplus._M_p = (pointer)0xbf800000bf800000;
    local_2c8.m_line._M_string_length = 0x3f80000000000000;
    pSVar19 = (Scalar *)0x0;
    pSVar18 = local_198;
    if (local_198 == local_190) {
      pSVar18 = pSVar19;
    }
    do {
      SVar3 = *(Scalar *)((long)&local_2c8.m_line._M_dataplus._M_p + (long)pSVar19 * 4);
      VariableType::getElementType((VariableType *)local_1e8);
      pSVar18[(long)pSVar19] = SVar3;
      pSVar19 = (Scalar *)((long)pSVar19 + 1);
    } while (pSVar19 != (Scalar *)0x4);
    local_2c8.m_line._M_dataplus._M_p = (pointer)0x3f8000003f800000;
    local_2c8.m_line._M_string_length = 0x3f80000000000000;
    pSVar19 = (Scalar *)0x0;
    pSVar18 = local_180;
    if (local_180 == local_178[0]) {
      pSVar18 = pSVar19;
    }
    do {
      SVar3 = *(Scalar *)((long)&local_2c8.m_line._M_dataplus._M_p + (long)pSVar19 * 4);
      VariableType::getElementType((VariableType *)local_1e8);
      pSVar18[(long)pSVar19] = SVar3;
      pSVar19 = (Scalar *)((long)pSVar19 + 1);
    } while (pSVar19 != (Scalar *)0x4);
    pSStack_210 = local_198;
    if (local_198 == local_190) {
      pSStack_210 = (Scalar *)0x0;
    }
    local_208 = local_180;
    if (local_180 == local_178[0]) {
      local_208 = (Scalar *)0x0;
    }
    value_03.m_min = pSStack_210;
    value_03.m_type = (VariableType *)local_1e8;
    value_03.m_max = local_208;
    local_218 = (VariableType *)local_1e8;
    VariableManager::setValue(this->m_state->m_varManager,variable_00,value_03);
    anon_unknown_26::createAssignment(&(shader->m_mainFunction).m_functionBlock,pVVar10,variable_00)
    ;
    ValueRange::~ValueRange((ValueRange *)local_1e8);
  }
  local_1e8._0_8_ = (GeneratorState *)0x0;
  local_1e8._8_8_ = (pointer)0x0;
  local_1e8._16_8_ = (pointer)0x0;
  ppVVar20 = (shader->m_globalScope).m_liveVariables.
             super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  lVar23 = (long)(shader->m_globalScope).m_liveVariables.
                 super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)ppVVar20 >> 3;
  if (lVar23 < 1) {
    local_2c8.m_line._M_dataplus._M_p = (pointer)0x0;
    local_2c8.m_line._M_string_length = 0;
    local_2c8.m_line.field_2._M_allocated_capacity = 0;
  }
  else {
    uVar24 = lVar23 + 1;
    __position_01._M_current = (Variable **)0x0;
    do {
      iVar13 = std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::insert
                         ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)local_1e8,
                          __position_01,ppVVar20);
      __position_01._M_current = iVar13._M_current + 1;
      ppVVar20 = ppVVar20 + 1;
      uVar24 = uVar24 - 1;
    } while (1 < uVar24);
    local_2c8.m_line._M_dataplus._M_p = (pointer)0x0;
    local_2c8.m_line._M_string_length = 0;
    local_2c8.m_line.field_2._M_allocated_capacity = 0;
    if (local_1e8._0_8_ != local_1e8._8_8_) {
      pGVar25 = (GeneratorState *)local_1e8._0_8_;
      do {
        local_290.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pGVar25->m_programParams;
        dVar9 = deStringBeginsWith((((Variable *)
                                    local_290.m_tokens.
                                    super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->m_name)._M_dataplus.
                                   _M_p,"gl_");
        if (*(Storage *)
             ((long)local_290.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                    _M_impl.super__Vector_impl_data._M_start + 0x50) == STORAGE_SHADER_IN) {
          pVVar14 = VariableManager::getValue
                              (this->m_state->m_varManager,
                               (Variable *)
                               local_290.m_tokens.
                               super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                               super__Vector_impl_data._M_start);
          std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::reserve
                    (&shader->m_inputs,
                     ((long)(shader->m_inputs).
                            super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(shader->m_inputs).
                            super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) + 1);
          pSVar15 = (ShaderInput *)operator_new(0x38);
          local_258.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)&pVVar14->m_valueRange;
          local_258.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pVVar14->m_valueRange).m_min.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_220 = (pVVar14->m_valueRange).m_max.
                      super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                      super__Vector_impl_data._M_start;
          if (local_258.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage ==
              (pVVar14->m_valueRange).m_min.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_258.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          }
          if (local_220 ==
              (pVVar14->m_valueRange).m_max.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_220 = (Scalar *)0x0;
          }
          valueRange_01.m_min =
               local_258.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
          valueRange_01.m_type =
               (VariableType *)
               local_258.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
               .super__Vector_impl_data._M_finish;
          valueRange_01.m_max = local_220;
          ShaderInput::ShaderInput
                    (pSVar15,(Variable *)
                             local_290.m_tokens.
                             super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                             super__Vector_impl_data._M_start,valueRange_01);
          local_268[0] = pSVar15;
          std::vector<rsg::ShaderInput*,std::allocator<rsg::ShaderInput*>>::
          emplace_back<rsg::ShaderInput*>
                    ((vector<rsg::ShaderInput*,std::allocator<rsg::ShaderInput*>> *)
                     &shader->m_inputs,local_268);
        }
        else if (*(Storage *)
                  ((long)local_290.m_tokens.
                         super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 0x50) == STORAGE_UNIFORM) {
          pVVar14 = VariableManager::getValue
                              (this->m_state->m_varManager,
                               (Variable *)
                               local_290.m_tokens.
                               super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                               super__Vector_impl_data._M_start);
          std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::reserve
                    (&shader->m_uniforms,
                     ((long)(shader->m_uniforms).
                            super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(shader->m_uniforms).
                            super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) + 1);
          pSVar15 = (ShaderInput *)operator_new(0x38);
          local_258.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)&pVVar14->m_valueRange;
          local_258.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pVVar14->m_valueRange).m_min.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_258.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pVVar14->m_valueRange).m_max.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
          if (local_258.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage ==
              (pVVar14->m_valueRange).m_min.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_258.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          }
          if (local_258.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start ==
              (pVVar14->m_valueRange).m_max.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_258.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_start = (Scalar *)0x0;
          }
          valueRange_00.m_min =
               local_258.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
          valueRange_00.m_type =
               (VariableType *)
               local_258.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
               .super__Vector_impl_data._M_finish;
          valueRange_00.m_max =
               local_258.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
               .super__Vector_impl_data._M_start;
          ShaderInput::ShaderInput
                    (pSVar15,(Variable *)
                             local_290.m_tokens.
                             super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                             super__Vector_impl_data._M_start,valueRange_00);
          local_268[0] = pSVar15;
          std::vector<rsg::ShaderInput*,std::allocator<rsg::ShaderInput*>>::
          emplace_back<rsg::ShaderInput*>
                    ((vector<rsg::ShaderInput*,std::allocator<rsg::ShaderInput*>> *)
                     &shader->m_uniforms,local_268);
        }
        if (dVar9 == 0) {
          if (local_2c8.m_line._M_string_length == local_2c8.m_line.field_2._M_allocated_capacity) {
            std::vector<rsg::Variable*,std::allocator<rsg::Variable*>>::
            _M_realloc_insert<rsg::Variable*const&>
                      ((vector<rsg::Variable*,std::allocator<rsg::Variable*>> *)&local_2c8,
                       (iterator)local_2c8.m_line._M_string_length,(Variable **)&local_290);
          }
          else {
            *(pointer *)local_2c8.m_line._M_string_length =
                 local_290.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            local_2c8.m_line._M_string_length = local_2c8.m_line._M_string_length + 8;
          }
        }
        else {
          VariableManager::declareVariable
                    (this->m_state->m_varManager,
                     (Variable *)
                     local_290.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                     _M_impl.super__Vector_impl_data._M_start);
        }
        pGVar25 = (GeneratorState *)&pGVar25->m_random;
      } while (pGVar25 != (GeneratorState *)local_1e8._8_8_);
    }
  }
  pGVar25 = this->m_state;
  local_290.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_290.m_tokens.
                         super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,3);
  __position._M_current =
       (pGVar25->m_exprFlagStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pGVar25->m_exprFlagStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pGVar25->m_exprFlagStack,
               __position,(uint *)&local_290);
  }
  else {
    *__position._M_current = 3;
    (pGVar25->m_exprFlagStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  if (local_2c8.m_line._M_dataplus._M_p != (pointer)local_2c8.m_line._M_string_length) {
    _Var26._M_p = local_2c8.m_line._M_dataplus._M_p;
    do {
      std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::reserve
                (&shader->m_globalStatements,
                 (long)(shader->m_globalStatements).
                       super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(shader->m_globalStatements).
                       super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3);
      this_00 = (DeclarationStatement *)operator_new(0x18);
      DeclarationStatement::DeclarationStatement(this_00,this->m_state,*(Variable **)_Var26._M_p);
      local_290.m_tokens.super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)this_00;
      std::vector<rsg::Statement*,std::allocator<rsg::Statement*>>::emplace_back<rsg::Statement*>
                ((vector<rsg::Statement*,std::allocator<rsg::Statement*>> *)
                 &shader->m_globalStatements,(Statement **)&local_290);
      _Var26._M_p = _Var26._M_p + 8;
    } while (_Var26._M_p != (pointer)local_2c8.m_line._M_string_length);
  }
  pVVar1 = local_270;
  ppuVar2 = &(this->m_state->m_exprFlagStack).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar2 = *ppuVar2 + -1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.m_line._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_2c8.m_line._M_dataplus._M_p,
                    local_2c8.m_line.field_2._M_allocated_capacity -
                    (long)local_2c8.m_line._M_dataplus._M_p);
  }
  if ((GeneratorState *)local_1e8._0_8_ != (GeneratorState *)0x0) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ - local_1e8._0_8_);
  }
  VariableManager::popVariableScope(pVVar1);
  VariableManager::popValueScope(pVVar1);
  anon_unknown_26::fillUndefinedShaderInputs(&shader->m_inputs);
  anon_unknown_26::fillUndefinedShaderInputs(&shader->m_uniforms);
  TokenStream::TokenStream(&local_290);
  Shader::tokenize(shader,this->m_state,&local_290);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  PrettyPrinter::PrettyPrinter(&local_2c8,(ostringstream *)local_1e8);
  if (this->m_state->m_programParams->version == VERSION_300) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"#version 300 es\n",0x10);
  }
  PrettyPrinter::append(&local_2c8,&local_290);
  std::__cxx11::stringbuf::str();
  pSVar15 = local_268[0];
  pcVar17 = (char *)(shader->m_source)._M_string_length;
  strlen((char *)local_268[0]);
  std::__cxx11::string::_M_replace((ulong)&shader->m_source,0,pcVar17,(ulong)pSVar15);
  if (local_268[0] != &local_258) {
    operator_delete(local_268[0],(ulong)((long)&((local_258.m_variable)->m_type).m_baseType + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.m_line._M_dataplus._M_p != &local_2c8.m_line.field_2) {
    operator_delete(local_2c8.m_line._M_dataplus._M_p,
                    local_2c8.m_line.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::ios_base::~ios_base((ios_base *)local_178);
  TokenStream::~TokenStream(&local_290);
  ValueScope::~ValueScope(&local_48);
  return;
}

Assistant:

void ShaderGenerator::generate (const ShaderParameters& shaderParams, Shader& shader, const vector<ShaderInput*>& outputs)
{
	// Global scopes
	VariableScope&	globalVariableScope	= shader.getGlobalScope();
	ValueScope		globalValueScope;

	// Init state
	m_state.setShader(shaderParams, shader);
	DE_ASSERT(m_state.getExpressionFlags() == 0);

	// Reserve some scalars for gl_Position & dEQP_Position
	ReservedScalars reservedScalars;
	if (shader.getType() == Shader::TYPE_VERTEX)
		m_state.getVariableManager().reserve(reservedScalars, 4*2);

	// Push global scopes
	m_varManager.pushVariableScope(globalVariableScope);
	m_varManager.pushValueScope(globalValueScope);

	// Init shader outputs.
	{
		for (vector<ShaderInput*>::const_iterator i = outputs.begin(); i != outputs.end(); i++)
		{
			const ShaderInput*	input		= *i;
			Variable*			variable	= m_state.getVariableManager().allocate(input->getVariable()->getType(), Variable::STORAGE_SHADER_OUT, input->getVariable()->getName());

			m_state.getVariableManager().setValue(variable, input->getValueRange());
		}

		if (shader.getType() == Shader::TYPE_FRAGMENT)
		{
			// gl_FragColor
			// \todo [2011-11-22 pyry] Multiple outputs from fragment shader!
			Variable*	fragColorVar	= m_state.getVariableManager().allocate(VariableType(VariableType::TYPE_FLOAT, 4), Variable::STORAGE_SHADER_OUT, getFragColorName(m_state));
			ValueRange	valueRange(fragColorVar->getType());

			valueRange.getMin() = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
			valueRange.getMax() = tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f);

			fragColorVar->setLayoutLocation(0); // Bind color output to location 0 (applies to GLSL ES 3.0 onwards).

			m_state.getVariableManager().setValue(fragColorVar, valueRange.asAccess());
		}
	}

	// Construct shader code.
	{
		Function& main = shader.getMain();
		main.setReturnType(VariableType(VariableType::TYPE_VOID));

		if (shaderParams.randomize)
		{
			FunctionGenerator funcGen(m_state, main);

			// Mandate assignment into to all shader outputs in main()
			const vector<Variable*>& liveVars = globalVariableScope.getLiveVariables();
			for (vector<Variable*>::const_iterator i = liveVars.begin(); i != liveVars.end(); i++)
			{
				Variable* variable = *i;
				if (variable->getStorage() == Variable::STORAGE_SHADER_OUT)
					funcGen.requireAssignment(variable);
			}

			funcGen.generate();
		}
		else
		{
			if (shader.getType() == Shader::TYPE_VERTEX)
				genVertexPassthrough(m_state, shader);
			else
			{
				DE_ASSERT(shader.getType() == Shader::TYPE_FRAGMENT);
				genFragmentPassthrough(m_state, shader);
			}
		}

		if (shader.getType() == Shader::TYPE_VERTEX)
		{
			// Add gl_Position = dEQP_Position;
			m_state.getVariableManager().release(reservedScalars);

			Variable* glPosVariable = m_state.getVariableManager().allocate(VariableType(VariableType::TYPE_FLOAT, 4), Variable::STORAGE_SHADER_OUT, "gl_Position");
			Variable* qpPosVariable = m_state.getVariableManager().allocate(VariableType(VariableType::TYPE_FLOAT, 4), Variable::STORAGE_SHADER_IN, "dEQP_Position");

			ValueRange valueRange(glPosVariable->getType());

			valueRange.getMin() = tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f);
			valueRange.getMax() = tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f);

			m_state.getVariableManager().setValue(qpPosVariable, valueRange.asAccess()); // \todo [2011-05-24 pyry] No expression should be able to use gl_Position or dEQP_Position..

			createAssignment(main.getBody(), glPosVariable, qpPosVariable);
		}
	}

	// Declare live global variables.
	{
		vector<Variable*> liveVariables;
		std::copy(globalVariableScope.getLiveVariables().begin(), globalVariableScope.getLiveVariables().end(), std::inserter(liveVariables, liveVariables.begin()));

		vector<Variable*> createDeclarationStatementVars;

		for (vector<Variable*>::iterator i = liveVariables.begin(); i != liveVariables.end(); i++)
		{
			Variable*		variable	= *i;
			const char*		name		= variable->getName();
			bool			declare		= !deStringBeginsWith(name, "gl_"); // Do not declare built-in types.

			// Create input entries (store value range) if necessary
			vector<ShaderInput*>& inputs	= shader.getInputs();
			vector<ShaderInput*>& uniforms	= shader.getUniforms();

			switch (variable->getStorage())
			{
				case Variable::STORAGE_SHADER_IN:
				{
					const ValueEntry* value = m_state.getVariableManager().getValue(variable);

					inputs.reserve(inputs.size()+1);
					inputs.push_back(new ShaderInput(variable, value->getValueRange()));
					break;
				}

				case Variable::STORAGE_UNIFORM:
				{
					const ValueEntry* value = m_state.getVariableManager().getValue(variable);

					uniforms.reserve(uniforms.size()+1);
					uniforms.push_back(new ShaderInput(variable, value->getValueRange()));
					break;
				}

				default:
					break;
			}

			if (declare)
				createDeclarationStatementVars.push_back(variable);
			else
			{
				// Just move to global scope without declaration statement.
				m_state.getVariableManager().declareVariable(variable);
			}
		}

		// All global initializers must be constant expressions, no variable allocation is allowed
		DE_ASSERT(m_state.getExpressionFlags() == 0);
		m_state.pushExpressionFlags(CONST_EXPR|NO_VAR_ALLOCATION);

		// Create declaration statements
		for (vector<Variable*>::iterator i = createDeclarationStatementVars.begin(); i != createDeclarationStatementVars.end(); i++)
		{
			shader.getGlobalStatements().reserve(shader.getGlobalStatements().size());
			shader.getGlobalStatements().push_back(new DeclarationStatement(m_state, *i));
		}

		m_state.popExpressionFlags();
	}

	// Pop global scopes
	m_varManager.popVariableScope();
	m_varManager.popValueScope();

	// Fill undefined (unused) components in inputs with dummy values
	fillUndefinedShaderInputs(shader.getInputs());
	fillUndefinedShaderInputs(shader.getUniforms());

	// Tokenize shader and write source
	{
		TokenStream tokenStr;
		shader.tokenize(m_state, tokenStr);

		std::ostringstream	str;
		PrettyPrinter		printer(str);

		// Append #version if necessary.
		if (m_state.getProgramParameters().version == VERSION_300)
			str << "#version 300 es\n";

		printer.append(tokenStr);
		shader.setSource(str.str().c_str());
	}
}